

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

void __thiscall lest::test::test(test *this,text *name_,function<void_(lest::env_&)> *behaviour_)

{
  std::__cxx11::string::string((string *)this,(string *)name_);
  std::function<void_(lest::env_&)>::function(&this->behaviour,behaviour_);
  return;
}

Assistant:

test( text name_, std::function<void( env & )> behaviour_ )
    : name( name_), behaviour( behaviour_) {}